

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O3

int __thiscall TPZCheckMesh::CheckConstraintDimension(TPZCheckMesh *this)

{
  int iVar1;
  size_t sVar2;
  TPZSavable TVar3;
  _Base_ptr p_Var4;
  int iVar5;
  TPZConnect *pTVar6;
  ostream *poVar7;
  long *plVar8;
  TPZCompEl **ppTVar9;
  long lVar10;
  TPZCompEl *pTVar11;
  long lVar12;
  _Base_ptr p_Var13;
  _Rb_tree_node_base *p_Var14;
  uint uVar15;
  undefined8 extraout_RDX;
  _Base_ptr p_Var16;
  _Self __tmp_1;
  long nelem;
  TPZDepend *pTVar17;
  int64_t size;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  int iVar20;
  int iVar21;
  TPZDepend *dep;
  int iVar22;
  _Self __tmp;
  undefined8 uVar23;
  pair<std::_Rb_tree_iterator<long>,_bool> pVar24;
  TPZCompElSide large;
  TPZVec<long> connecttoel;
  set<long,_std::less<long>,_std::allocator<long>_> largecon;
  TPZGeoElSide gelside;
  TPZStack<TPZCompElSide,_10> equal;
  set<long,_std::less<long>,_std::allocator<long>_> badcon;
  set<long,_std::less<long>,_std::allocator<long>_> badelements;
  TPZGeoElSide gellarge;
  TPZGeoElSide local_210;
  _func_int **local_1f8;
  TPZVec<long> local_1f0;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_1d0;
  undefined8 local_1a0;
  _func_int **local_198;
  undefined **local_190;
  long local_188;
  undefined **local_180;
  TPZGeoEl *local_178;
  int local_170 [2];
  TPZStack<TPZCompElSide,_10> local_168;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_a8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_78;
  TPZGeoElSide local_48;
  
  size = (this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar23 = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
       (_func_int **)0x0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (long)(int)size) {
    uVar23 = 0;
    do {
      pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                          (int64_t)local_168.super_TPZManVector<TPZCompElSide,_10>.
                                   super_TPZVec<TPZCompElSide>._vptr_TPZVec);
      uVar15 = (uint)pTVar6->fSequenceNumber;
      if ((-1 < (int)uVar15) && (pTVar17 = pTVar6->fDependList, pTVar17 != (TPZDepend *)0x0)) {
        iVar5 = (this->fMesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                [uVar15 & 0x7fffffff].dim;
        do {
          iVar22 = (int)(pTVar17->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                        super_TPZBaseMatrix.fRow;
          iVar21 = (int)(pTVar17->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                        super_TPZBaseMatrix.fCol;
          iVar20 = (int)pTVar17->fDepConnectIndex;
          pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                             (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                              (long)iVar20);
          iVar1 = (this->fMesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                  [(int)pTVar6->fSequenceNumber].dim;
          if ((this->fNState * iVar22 != iVar5) || (this->fNState * iVar21 != iVar1)) {
            std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
            _M_insert_unique<long_const&>
                      ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                        *)&local_a8,(long *)&local_168);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"TPZCheckMesh::CheckConstraintDi.. ic = ",0x27);
            poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," depends on ",0xc);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar20);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," r ",3);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," iblsize ",9);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," c ",3);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar21);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," jblsize ",9);
            plVar8 = (long *)std::ostream::operator<<(poVar7,iVar1);
            std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
            std::ostream::put((char)plVar8);
            uVar23 = 1;
            std::ostream::flush();
          }
          pTVar17 = pTVar17->fNext;
        } while (pTVar17 != (TPZDepend *)0x0);
      }
      local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
           (_func_int **)
           ((long)local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                  _vptr_TPZVec + 1);
    } while ((long)local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                   _vptr_TPZVec < (long)(int)size);
    size = (this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
  }
  local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
       (_func_int **)0xffffffffffffffff;
  local_1a0 = uVar23;
  TPZVec<long>::TPZVec(&local_1f0,size,(long *)&local_168);
  lVar12 = (this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar12) {
    nelem = 0;
    do {
      ppTVar9 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      pTVar11 = *ppTVar9;
      if ((pTVar11 != (TPZCompEl *)0x0) &&
         (iVar5 = (**(code **)(*(long *)pTVar11 + 0x90))(pTVar11), 0 < iVar5)) {
        iVar22 = 0;
        do {
          lVar10 = (**(code **)(*(long *)pTVar11 + 0xa0))(pTVar11,iVar22);
          if (local_1f0.fStore[lVar10] == -1) {
            local_1f0.fStore[lVar10] = nelem;
          }
          iVar22 = iVar22 + 1;
        } while (iVar5 != iVar22);
      }
      nelem = nelem + 1;
    } while (nelem != lVar12);
  }
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_a8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_a8._M_impl.super__Rb_tree_header) {
    local_190 = &PTR__TPZGeoElSide_018f8760;
    local_198 = (_func_int **)&PTR__TPZManVector_0181a690;
    local_1f8 = (_func_int **)&PTR__TPZVec_018142b0;
    p_Var13 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      lVar12 = local_1f0.fStore[*(long *)(p_Var13 + 1)];
      if (lVar12 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Connect ",8);
        poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," has dependency but does not belong to an element\n",0x32);
        lVar12 = local_1f0.fStore[*(long *)(p_Var13 + 1)];
      }
      ppTVar9 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,lVar12)
      ;
      if ((*ppTVar9 == (TPZCompEl *)0x0) ||
         (pTVar11 = (TPZCompEl *)
                    __dynamic_cast(*ppTVar9,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0
                                  ), pTVar11 == (TPZCompEl *)0x0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"I dont understand\n",0x12);
      }
      else {
        local_210._20_4_ = (**(code **)(*(long *)pTVar11 + 0x90))();
        if (0 < (int)local_210._20_4_) {
          iVar5 = 0;
          do {
            lVar12 = (**(code **)(*(long *)pTVar11 + 0xa0))();
            if (lVar12 == *(long *)(p_Var13 + 1)) {
              local_178 = TPZCompEl::Reference(pTVar11);
              local_180 = local_190;
              local_170[0] = iVar5;
              TPZGeoElSide::LowerLevelCompElementList2(&local_210,(int)&local_180);
              if ((TPZCompEl *)local_210.super_TPZSavable._vptr_TPZSavable == (TPZCompEl *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"I dont understand\n",0x12);
              }
              else {
                TPZCompElSide::Reference(&local_48,(TPZCompElSide *)&local_210);
                lVar12 = 0x28;
                do {
                  *(undefined8 *)((long)local_170 + lVar12) = 0;
                  *(undefined4 *)
                   ((long)&(((TPZManVector<TPZCompElSide,_10> *)
                            (local_168.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + -2))->
                           super_TPZVec<TPZCompElSide>)._vptr_TPZVec + lVar12) = 0xffffffff;
                  lVar12 = lVar12 + 0x10;
                } while (lVar12 != 200);
                local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
                     local_168.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc;
                local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                fNElements = 0;
                local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc
                     = 0;
                local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                _vptr_TPZVec = local_198;
                TPZGeoElSide::EqualLevelCompElementList(&local_48,&local_168,1,0);
                iVar22 = (int)local_210.fGeoEl;
                TVar3._vptr_TPZSavable = local_210.super_TPZSavable._vptr_TPZSavable;
                (*local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                  _vptr_TPZVec[3])(&local_168,
                                   local_168.super_TPZManVector<TPZCompElSide,_10>.
                                   super_TPZVec<TPZCompElSide>.fNElements + 1);
                local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore
                [local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                 fNElements + -1].fEl = (TPZCompEl *)TVar3._vptr_TPZSavable;
                local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore
                [local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                 fNElements + -1].fSide = iVar22;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Connect index ",0xe);
                poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7," belongs to element ",0x14);
                poVar7 = std::ostream::_M_insert<long>((long)poVar7);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7," and is restrained by element ",0x1e);
                if (0 < local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                        fNElements) {
                  lVar12 = 0;
                  do {
                    poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                    lVar12 = lVar12 + 1;
                  } while (lVar12 < local_168.super_TPZManVector<TPZCompElSide,_10>.
                                    super_TPZVec<TPZCompElSide>.fNElements);
                }
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
                std::ostream::put(-0x58);
                std::ostream::flush();
                local_1d0._M_impl._0_8_ = local_210.super_TPZSavable._vptr_TPZSavable[2];
                std::
                _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
                _M_insert_unique<long>(&local_78,(long *)&local_1d0);
                iVar22 = (**(code **)(*local_210.super_TPZSavable._vptr_TPZSavable + 0x90))();
                local_1d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_1d0._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_1d0._M_impl.super__Rb_tree_header._M_header;
                local_1d0._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_1d0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_1d0._M_impl.super__Rb_tree_header._M_header._M_left;
                if (0 < iVar22) {
                  iVar21 = 0;
                  uVar23 = extraout_RDX;
                  do {
                    local_188 = (**(code **)(*local_210.super_TPZSavable._vptr_TPZSavable + 0xa0))
                                          (local_210.super_TPZSavable._vptr_TPZSavable,iVar21,uVar23
                                          );
                    pVar24 = std::
                             _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                             ::_M_insert_unique<long>(&local_1d0,&local_188);
                    uVar23 = pVar24._8_8_;
                    iVar21 = iVar21 + 1;
                  } while (iVar22 != iVar21);
                }
                pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                                   (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>
                                    ,*(int64_t *)(p_Var13 + 1));
                for (pTVar17 = pTVar6->fDependList; pTVar17 != (TPZDepend *)0x0;
                    pTVar17 = pTVar17->fNext) {
                  if (local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
                  {
LAB_010d121a:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"The connect ",0xc);
                    poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7," belongs to element ",0x14);
                    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7," as connect ",0xc);
                    plVar8 = (long *)std::ostream::operator<<(poVar7,iVar5);
                    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
                    std::ostream::put((char)plVar8);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "The element is restrained along this side to element ",0x35);
                    poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                    std::ostream::put((char)poVar7);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"The connect ",0xc);
                    poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7," depends on connect ",0x14);
                    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7," The connect of the large element are ",0x26);
                    if (0 < iVar22) {
                      iVar21 = 0;
                      do {
                        (**(code **)(*local_210.super_TPZSavable._vptr_TPZSavable + 0xa0))
                                  (local_210.super_TPZSavable._vptr_TPZSavable,iVar21);
                        poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                        iVar21 = iVar21 + 1;
                      } while (iVar22 != iVar21);
                    }
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
                    std::ostream::put(-0x58);
                    std::ostream::flush();
                  }
                  else {
                    lVar12 = pTVar17->fDepConnectIndex;
                    p_Var4 = local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent;
                    p_Var19 = &local_1d0._M_impl.super__Rb_tree_header._M_header;
                    do {
                      p_Var18 = p_Var19;
                      p_Var16 = p_Var4;
                      sVar2 = *(size_t *)(p_Var16 + 1);
                      p_Var19 = p_Var16;
                      if ((long)sVar2 < lVar12) {
                        p_Var19 = p_Var18;
                      }
                      p_Var4 = (&p_Var16->_M_left)[(long)sVar2 < lVar12];
                    } while ((&p_Var16->_M_left)[(long)sVar2 < lVar12] != (_Base_ptr)0x0);
                    if ((_Rb_tree_header *)p_Var19 == &local_1d0._M_impl.super__Rb_tree_header)
                    goto LAB_010d121a;
                    if ((long)sVar2 < lVar12) {
                      p_Var16 = p_Var18;
                    }
                    if (lVar12 < (long)*(size_t *)(p_Var16 + 1)) goto LAB_010d121a;
                  }
                }
                std::
                _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
                ~_Rb_tree(&local_1d0);
                if (local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                    fStore != local_168.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc) {
                  local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                  fNAlloc = 0;
                  local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                  _vptr_TPZVec = local_1f8;
                  if (local_168.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                      fStore != (TPZCompElSide *)0x0) {
                    operator_delete__(local_168.super_TPZManVector<TPZCompElSide,_10>.
                                      super_TPZVec<TPZCompElSide>.fStore);
                  }
                }
              }
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 != local_210._20_4_);
        }
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while ((_Rb_tree_header *)p_Var13 != &local_a8._M_impl.super__Rb_tree_header);
    for (p_Var14 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var14 != &local_78._M_impl.super__Rb_tree_header;
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
      ppTVar9 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,
                           *(int64_t *)(p_Var14 + 1));
      (**(code **)(*(long *)*ppTVar9 + 200))(*ppTVar9,&std::cout);
    }
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_78);
  local_1f0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  if (local_1f0.fStore != (long *)0x0) {
    operator_delete__(local_1f0.fStore);
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_a8);
  return (int)local_1a0;
}

Assistant:

int TPZCheckMesh::CheckConstraintDimension()
{
	int check = 0;
	int ncon = fMesh->ConnectVec().NElements();
    std::set<int64_t> badcon;
	for(int64_t ic=0; ic<ncon; ic++) {
		TPZConnect &con = fMesh->ConnectVec()[ic];
		int iseqnum = con.SequenceNumber();
        if (iseqnum < 0) {
            continue;
        }
		int iblsize = fMesh->Block().Size(iseqnum);
		if(con.HasDependency()) {
			TPZConnect::TPZDepend *dep = con.FirstDepend();
			while(dep) {
				int r = dep->fDepMatrix.Rows();
				int c = dep->fDepMatrix.Cols();
				int jcind = dep->fDepConnectIndex;
				TPZConnect &jcon = fMesh->ConnectVec()[jcind];
				int jseqnum = jcon.SequenceNumber();
				int jblsize = fMesh->Block().Size(jseqnum);
				if(r*fNState != iblsize || c*fNState != jblsize) {
                    badcon.insert(ic);
					cout << "TPZCheckMesh::CheckConstraintDi.. ic = " << ic
					<< " depends on " << jcind << " r " << r << " iblsize "
					<< iblsize  << " c " << c << " jblsize " << jblsize << endl;
					check = 1;
				}
				dep = dep->fNext;
			}
		}
	}
    TPZVec<int64_t> connecttoel(fMesh->NConnects(),-1);
    int64_t nelem = fMesh->NElements();
    for (int64_t el=0; el<nelem; el++) {
        TPZCompEl *cel = fMesh->Element(el);
        if (!cel) {
            continue;
        }
        int nc = cel->NConnects();
        for (int ic=0; ic<nc; ic++) {
            int64_t cindex = cel->ConnectIndex(ic);
            if (connecttoel[cindex] == -1) {
                connecttoel[cindex] = el;
            }
        }
    }
    std::set<int64_t> badelements;
    for (std::set<int64_t>::iterator it = badcon.begin(); it != badcon.end(); it++) {
        /// find the element that contains badcon
        if (connecttoel[*it] == -1) {
            std::cout << "Connect " << *it << " has dependency but does not belong to an element\n";
        }
        TPZCompEl *cel = fMesh->Element(connecttoel[*it]);
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);
        if (!intel) {
            std::cout << "I dont understand\n";
            continue;
        }
        int nc = intel->NConnects();
        for (int ic = 0; ic<nc; ic++) {
            if (intel->ConnectIndex(ic) == *it)
            {
                TPZGeoEl *ref = intel->Reference();
                TPZGeoElSide gelside(ref,ic);
                TPZCompElSide large = gelside.LowerLevelCompElementList2(1);
                if (!large) {
                    std::cout << "I dont understand\n";
                    continue;
                }
                TPZGeoElSide gellarge = large.Reference();
                TPZStack<TPZCompElSide> equal;
                gellarge.EqualLevelCompElementList(equal, 1, 0);
                equal.Push(large);
                std::cout << "Connect index " << *it << " belongs to element " << connecttoel[*it] << " and is restrained by element ";
                for(int i=0; i< equal.size(); i++) std::cout << equal[i].Element()->Index() << " ";
                std::cout << std::endl;
                badelements.insert(large.Element()->Index());
                
                int nclarge = large.Element()->NConnects();
                std::set<int64_t> largecon;
                for (int icl=0; icl< nclarge; icl++) {
                    largecon.insert(large.Element()->ConnectIndex(icl));
                }
                TPZConnect &c = fMesh->ConnectVec()[*it];
                TPZConnect::TPZDepend *dep = c.FirstDepend();
                while(dep)
                {
                    if (largecon.find(dep->fDepConnectIndex) == largecon.end()) {
                        std::cout << "The connect " << *it << " belongs to element " << connecttoel[*it] << " as connect " << ic << std::endl;
                        std::cout << "The element is restrained along this side to element " << large.Element()->Index() << std::endl;
                        std::cout << "The connect " << *it << " depends on connect " << dep->fDepConnectIndex << " The connect of the large element are ";
                        for (int ic=0; ic<nclarge; ic++) {
                            std::cout << large.Element()->ConnectIndex(ic) << " ";
                        }
                        std::cout << std::endl;
                    }
                    dep = dep->fNext;
                }
            }
        }
    }
    for (std::set<int64_t>::iterator it=badelements.begin(); it != badelements.end(); it++) {
        fMesh->Element(*it)->Print();
    }
	return check;
}